

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::sext(SVInt *this,bitwidth_t bits)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  char cVar5;
  uint64_t *puVar6;
  byte bVar7;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  long *plVar10;
  uint64_t uVar11;
  ulong __n;
  long *__src;
  size_t __n_00;
  uint uVar12;
  SVInt SVar13;
  
  plVar10 = (long *)CONCAT44(in_register_00000034,bits);
  if ((in_EDX < 0x41) && (*(char *)((long)plVar10 + 0xd) == '\0')) {
    cVar5 = (char)(int)plVar10[1];
    SVInt(this,in_EDX,
          (ulong)((*plVar10 << (-cVar5 & 0x3fU)) >> ((char)in_EDX - cVar5 & 0x3fU)) >>
          (-(char)in_EDX & 0x3fU),*(bool *)((long)plVar10 + 0xc));
    uVar8 = extraout_RDX_00;
  }
  else {
    bVar2 = *(bool *)((long)plVar10 + 0xc);
    bVar3 = *(bool *)((long)plVar10 + 0xd);
    uVar9 = in_EDX + 0x3f >> 6;
    puVar6 = (uint64_t *)operator_new__((ulong)((uVar9 << (bVar3 & 0x1fU)) << 3));
    (this->super_SVIntStorage).field_0.pVal = puVar6;
    (this->super_SVIntStorage).bitWidth = in_EDX;
    (this->super_SVIntStorage).signFlag = bVar2;
    (this->super_SVIntStorage).unknownFlag = bVar3;
    uVar1 = *(uint *)(plVar10 + 1) + 0x3f;
    uVar12 = uVar1 >> 6;
    plVar4 = (long *)*plVar10;
    __src = plVar10;
    if ((bVar3 & 1U) != 0) {
      __src = plVar4;
    }
    if (0x40 < *(uint *)(plVar10 + 1)) {
      __src = plVar4;
    }
    __n = (ulong)(uVar12 * 8);
    memcpy(puVar6,__src,__n);
    bVar7 = ~(byte)uVar1 & 0x3f;
    uVar1 = uVar12 - 1;
    uVar11 = (long)(puVar6[uVar1] << bVar7) >> bVar7;
    puVar6[uVar1] = uVar11;
    __n_00 = (ulong)(uVar9 - uVar12) << 3;
    memset((void *)((long)puVar6 + __n),(int)((long)uVar11 >> 0x3f),__n_00);
    if (bVar3 == true) {
      puVar6 = puVar6 + uVar9;
      memcpy(puVar6,(void *)((long)plVar4 + (ulong)(uVar12 << 3)),__n);
      uVar11 = (long)(puVar6[uVar1] << bVar7) >> bVar7;
      puVar6[uVar1] = uVar11;
      memset((void *)((long)puVar6 + (ulong)(uVar12 << 3)),(int)((long)uVar11 >> 0x3f),__n_00);
    }
    clearUnusedBits(this);
    uVar8 = extraout_RDX;
  }
  SVar13.super_SVIntStorage.bitWidth = (int)uVar8;
  SVar13.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar8 >> 0x20);
  SVar13.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar8 >> 0x28);
  SVar13.super_SVIntStorage._14_2_ = (short)((ulong)uVar8 >> 0x30);
  SVar13.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar13.super_SVIntStorage;
}

Assistant:

SVInt SVInt::sext(bitwidth_t bits) const {
    SLANG_ASSERT(bits > bitWidth);

    if (bits <= SVInt::BITS_PER_WORD && !unknownFlag) {
        uint64_t newVal = val << (SVInt::BITS_PER_WORD - bitWidth); // NOLINT
        newVal = uint64_t((int64_t)newVal >> (bits - bitWidth));
        return SVInt(bits, newVal >> (SVInt::BITS_PER_WORD - bits), signFlag);
    }

    // copy and sign extend; for unknown values, this copies the data words
    // but not the unknown-indicator words, which we do separately below
    SVInt result = SVInt::allocUninitialized(bits, signFlag, unknownFlag);
    uint32_t oldWords = SVInt::getNumWords(bitWidth, false);
    uint32_t newWords = SVInt::getNumWords(bits, false);
    signExtendCopy(result.pVal, getRawData(), bitWidth, oldWords, newWords);

    if (unknownFlag)
        signExtendCopy(result.pVal + newWords, pVal + oldWords, bitWidth, oldWords, newWords);

    result.clearUnusedBits();
    return result;
}